

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator<
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  char *lhs;
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0;
  text local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  bool local_49;
  result local_48;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_char_(&)[6]> *this_local;
  
  lhs = *(char **)this;
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_char_(&)[6]> *)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,rhs);
  local_49 = nonstd::sv_lite::operator<(lhs,&local_60);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"<",&local_e1);
  std::__cxx11::string::string(local_c0,local_e0);
  to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_a0,this_00,(char (*) [6])local_c0,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_a0);
  result::result<bool>(&local_48,&local_49,&local_80);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }